

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O1

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::U8,_(ritobin::Category)1>::from_json
          (ErrorStackOption *__return_storage_ptr__,U8 *value,json *json)

{
  uchar ret;
  U8 local_48 [33];
  undefined8 local_27;
  undefined4 local_1f;
  undefined2 local_1b;
  undefined1 local_19;
  
  if ((byte)(json->m_type - number_integer) < 3) {
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
              (json,&local_48[0].value);
    value->value = (uint8_t)local_48[0];
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
  }
  else {
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type = "u8"
    ;
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.message =
         "json.is_number()";
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
    _M_dataplus._M_p =
         (pointer)((long)&(__return_storage_ptr__->
                          super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                          _M_payload.
                          super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                          .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                          _M_payload + 0x20);
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
             super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x20) = 0
    ;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
             super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.
             path.field_2 + 1) = local_27;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
             super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x29) =
         local_1f;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
             super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2d) =
         local_1b;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
             super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2f) =
         local_19;
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
    _M_string_length = 0;
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            using value_t = std::remove_cvref_t<decltype(value.value)>;
            if constexpr (std::is_same_v<value_t, bool>) {
                bin_json_assert(json.is_boolean());
            } else {
                bin_json_assert(json.is_number());
            }
            value.value = json;
            return std::nullopt;
        }